

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O2

void pythonAttributeDecl(void *user_data,xmlChar *elem,xmlChar *name,int type,int def,
                        xmlChar *defaultValue,xmlEnumerationPtr tree)

{
  int iVar1;
  _xmlEnumeration *p_Var2;
  PyObject *op;
  PyObject *pPVar3;
  long lVar4;
  
  iVar1 = PyObject_HasAttrString(user_data,"attributeDecl");
  if (iVar1 != 0) {
    lVar4 = 0;
    for (p_Var2 = tree; p_Var2 != (xmlEnumerationPtr)0x0; p_Var2 = p_Var2->next) {
      lVar4 = lVar4 + 1;
    }
    op = (PyObject *)PyList_New(lVar4);
    lVar4 = 0;
    for (; tree != (xmlEnumerationPtr)0x0; tree = tree->next) {
      pPVar3 = (PyObject *)PyUnicode_FromString(tree->name);
      PyList_SetItem(op,lVar4,pPVar3);
      _Py_DECREF(pPVar3);
      lVar4 = lVar4 + 1;
    }
    pPVar3 = (PyObject *)
             _PyObject_CallMethod_SizeT
                       (user_data,"attributeDecl","ssiisO",elem,name,type,def,defaultValue,op);
    lVar4 = PyErr_Occurred();
    if (lVar4 != 0) {
      PyErr_Print();
    }
    _Py_XDECREF(op);
    _Py_XDECREF(pPVar3);
    return;
  }
  return;
}

Assistant:

static void
pythonAttributeDecl(void *user_data,
                    const xmlChar * elem,
                    const xmlChar * name,
                    int type,
                    int def,
                    const xmlChar * defaultValue, xmlEnumerationPtr tree)
{
    PyObject *handler;
    PyObject *nameList;
    PyObject *newName;
    xmlEnumerationPtr node;
    PyObject *result;
    int count;

    handler = (PyObject *) user_data;
    if (PyObject_HasAttrString(handler, (char *) "attributeDecl")) {
        count = 0;
        for (node = tree; node != NULL; node = node->next) {
            count++;
        }
        nameList = PyList_New(count);
        count = 0;
        for (node = tree; node != NULL; node = node->next) {
            newName = PY_IMPORT_STRING((char *) node->name);
            PyList_SetItem(nameList, count, newName);
	    Py_DECREF(newName);
            count++;
        }
        result = PyObject_CallMethod(handler, (char *) "attributeDecl",
                                     (char *) "ssiisO", elem, name, type,
                                     def, defaultValue, nameList);
        if (PyErr_Occurred())
            PyErr_Print();
        Py_XDECREF(nameList);
        Py_XDECREF(result);
    }
}